

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O0

bool __thiscall
glcts::ViewportArray::DrawTestBase::checkResults
          (DrawTestBase *this,texture *texture_0,texture *param_2,GLuint param_3)

{
  GLint expected_value;
  bool bVar1;
  reference pvVar2;
  uint local_5c;
  uint uStack_58;
  bool result;
  GLuint x;
  GLuint y;
  undefined1 local_48 [8];
  vector<int,_std::allocator<int>_> texture_data;
  bool local_25;
  GLint index;
  bool check_result;
  GLuint param_3_local;
  texture *param_2_local;
  texture *texture_0_local;
  DrawTestBase *this_local;
  
  local_25 = true;
  texture_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_48);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)local_48,0x4000);
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_48,0);
  Utils::texture::get(texture_0,0x8d94,0x1404,pvVar2);
  uStack_58 = 0;
  do {
    if (3 < uStack_58) {
LAB_016fbbbe:
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_48)
      ;
      return local_25;
    }
    for (local_5c = 0;
        expected_value =
             texture_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_, local_5c < 4; local_5c = local_5c + 1)
    {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_48,0);
      bVar1 = checkRegionR32I(this,local_5c,uStack_58,expected_value,pvVar2);
      if (!bVar1) {
        local_25 = false;
        goto LAB_016fbbbe;
      }
      texture_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ =
           texture_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
    }
    uStack_58 = uStack_58 + 1;
  } while( true );
}

Assistant:

bool DrawTestBase::checkResults(Utils::texture& texture_0, Utils::texture& /* texture_1 */, GLuint /*draw_call_index */)
{
	bool  check_result = true;
	GLint index		   = 0;

	std::vector<GLint> texture_data;
	texture_data.resize(m_width * m_height);
	texture_0.get(GL_RED_INTEGER, GL_INT, &texture_data[0]);

	for (GLuint y = 0; y < 4; ++y)
	{
		for (GLuint x = 0; x < 4; ++x)
		{
			bool result = checkRegionR32I(x, y, index, &texture_data[0]);

			if (false == result)
			{
				check_result = false;
				goto end;
			}

			index += 1;
		}
	}

end:
	return check_result;
}